

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_arraypop(HSQUIRRELVM v,SQInteger idx,SQBool pushval)

{
  bool bVar1;
  SQInteger SVar2;
  SQInteger SVar3;
  SQObjectPtr *o;
  SQObjectPtr *local_30;
  SQObjectPtr *arr;
  SQBool pushval_local;
  SQInteger idx_local;
  HSQUIRRELVM v_local;
  
  arr = (SQObjectPtr *)pushval;
  pushval_local = idx;
  idx_local = (SQInteger)v;
  SVar2 = sq_gettop(v);
  if (SVar2 < 1) {
    SQVM::Raise_Error((SQVM *)idx_local,"not enough params in the stack");
    v_local = (HSQUIRRELVM)0xffffffffffffffff;
  }
  else {
    bVar1 = sq_aux_gettypedarg((HSQUIRRELVM)idx_local,pushval_local,OT_ARRAY,&local_30);
    if (bVar1) {
      SVar3 = SQArray::Size((local_30->super_SQObject)._unVal.pArray);
      SVar2 = idx_local;
      if (SVar3 < 1) {
        v_local = (HSQUIRRELVM)sq_throwerror((HSQUIRRELVM)idx_local,"empty array");
      }
      else {
        if (arr != (SQObjectPtr *)0x0) {
          o = SQArray::Top((local_30->super_SQObject)._unVal.pArray);
          SQVM::Push((SQVM *)SVar2,o);
        }
        SQArray::Pop((local_30->super_SQObject)._unVal.pArray);
        v_local = (HSQUIRRELVM)0x0;
      }
    }
    else {
      v_local = (HSQUIRRELVM)0xffffffffffffffff;
    }
  }
  return (SQRESULT)v_local;
}

Assistant:

SQRESULT sq_arraypop(HSQUIRRELVM v,SQInteger idx,SQBool pushval)
{
    sq_aux_paramscheck(v, 1);
    SQObjectPtr *arr;
    _GETSAFE_OBJ(v, idx, OT_ARRAY,arr);
    if(_array(*arr)->Size() > 0) {
        if(pushval != 0){ v->Push(_array(*arr)->Top()); }
        _array(*arr)->Pop();
        return SQ_OK;
    }
    return sq_throwerror(v, _SC("empty array"));
}